

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

string * __thiscall
symbols::StringObject::toString_abi_cxx11_(string *__return_storage_ptr__,StringObject *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  StringObject *local_18;
  StringObject *this_local;
  
  local_18 = this;
  this_local = (StringObject *)__return_storage_ptr__;
  std::operator+(&local_38,"\'",&this->value);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string StringObject::toString() const
{
    return "'" + value + "'";
}